

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator=
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
          *other)

{
  ulong nbRows;
  long size;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 *puVar3;
  undefined8 uVar4;
  DenseStorage<double,__1,__1,_1,_0> local_28;
  
  nbRows = *(ulong *)(*(long *)other + 8);
  if (nbRows != 0) {
    auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
    uVar4 = SUB168(auVar2 % SEXT816((long)nbRows),0);
    if ((long)nbRows <= SUB168(auVar2 / SEXT816((long)nbRows),0)) {
      if ((long)nbRows < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                      ,0xf1,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = nbRows;
      auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
      uVar4 = SUB168(auVar1 % auVar2,0);
      if (nbRows <= SUB168(auVar1 / auVar2,0)) goto LAB_00128f32;
    }
    puVar3 = (undefined8 *)__cxa_allocate_exception(8,other,uVar4);
    *puVar3 = operator_delete;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
LAB_00128f32:
  DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this,nbRows * nbRows,nbRows,nbRows);
  size = *(long *)(*(long *)other + 8);
  DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_28,size,size,1);
  if (-1 < size) {
    HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
    evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
                *)other,(Matrix<double,__1,__1,_0,__1,__1> *)this,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_28);
    free(local_28.m_data);
    return (Matrix<double,__1,__1,_0,__1,__1> *)this;
  }
  __assert_fail("dim >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                ,0xf0,
                "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
               );
}

Assistant:

EIGEN_STRONG_INLINE Derived& operator=(const EigenBase<OtherDerived> &other)
    {
      _resize_to_match(other);
      Base::operator=(other.derived());
      return this->derived();
    }